

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

void __thiscall CFG::removeNullableSymbol(CFG *this,string *symbol,Production *production)

{
  size_t sVar1;
  iterator iVar2;
  pointer ppPVar3;
  pointer ppPVar4;
  bool bVar5;
  int iVar6;
  Production *pPVar7;
  Production *this_00;
  long lVar8;
  ulong uVar9;
  value_type *__x;
  CFG *pCVar10;
  int iVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Production *newProduction;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  productionsTo;
  Production *newProduction_1;
  undefined1 local_128 [40];
  Production *pPStack_100;
  pointer local_f8;
  pointer local_e8;
  _Alloc_hider local_e0;
  Production *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<Production*,std::allocator<Production*>> *local_78;
  Production *local_70;
  vector<Production_*,_std::allocator<Production_*>_> local_68;
  Production *local_50;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_48;
  
  local_d8 = production;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_d0,&production->toP);
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_d0._8_8_ != local_d0._M_allocated_capacity) {
    lVar8 = 0;
    uVar9 = 0;
    bVar5 = false;
    iVar11 = 0;
    uVar12 = local_d0._8_8_;
    uVar13 = local_d0._M_allocated_capacity;
    local_e0._M_p = (pointer)this;
    do {
      sVar1 = *(size_t *)(uVar13 + 8 + lVar8);
      if (sVar1 == symbol->_M_string_length) {
        if (sVar1 != 0) {
          iVar6 = bcmp((((value_type *)(uVar13 + lVar8))->_M_dataplus)._M_p,
                       (symbol->_M_dataplus)._M_p,sVar1);
          if (iVar6 != 0) goto LAB_00129647;
        }
        iVar11 = iVar11 + 1;
        bVar5 = true;
      }
      else {
LAB_00129647:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_98,(value_type *)(uVar13 + lVar8));
        uVar12 = local_d0._8_8_;
        uVar13 = local_d0._M_allocated_capacity;
      }
      this = (CFG *)local_e0._M_p;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 < (ulong)((long)(uVar12 - uVar13) >> 5));
    if (bVar5) {
      pPVar7 = (Production *)operator_new(0x38);
      Production::Production(pPVar7,&local_d8->fromP,&local_98);
      iVar2._M_current = *(pointer *)((long)this + 0x38);
      local_128._32_8_ = pPVar7;
      if (iVar2._M_current == *(pointer *)((long)this + 0x40)) {
        std::vector<Production*,std::allocator<Production*>>::_M_realloc_insert<Production*const&>
                  ((vector<Production*,std::allocator<Production*>> *)((long)this + 0x30),iVar2,
                   (Production **)(local_128 + 0x20));
      }
      else {
        *iVar2._M_current = pPVar7;
        *(pointer *)((long)this + 0x38) = *(pointer *)((long)this + 0x38) + 1;
      }
    }
    if (1 < iVar11) {
      findPermutations((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                        *)local_128,this,iVar11);
      pCVar10 = (CFG *)local_128;
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::vector(&local_48,
               (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                *)pCVar10);
      filterAll0orAll1((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                        *)&local_b8,pCVar10,&local_48);
      local_f8 = (pointer)local_128._16_8_;
      pPStack_100 = (Production *)local_128._8_8_;
      local_128._32_8_ = local_128._0_8_;
      local_128._16_8_ =
           local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_128._0_8_ =
           local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_128._8_8_ =
           local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 *)(local_128 + 0x20));
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 *)&local_b8);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector(&local_48);
      local_70 = (Production *)local_128._8_8_;
      if (local_128._0_8_ != local_128._8_8_) {
        local_78 = (vector<Production*,std::allocator<Production*>> *)((long)this + 0x30);
        pPVar7 = (Production *)local_128._0_8_;
        do {
          std::vector<bool,_std::allocator<bool>_>::vector
                    ((vector<bool,_std::allocator<bool>_> *)(local_128 + 0x20),
                     (vector<bool,_std::allocator<bool>_> *)pPVar7);
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (local_d0._8_8_ != local_d0._M_allocated_capacity) {
            lVar8 = 0;
            uVar9 = 0;
            iVar11 = 0;
            do {
              sVar1 = *(size_t *)(local_d0._M_allocated_capacity + 8 + lVar8);
              __x = (value_type *)(local_d0._M_allocated_capacity + lVar8);
              if (sVar1 == symbol->_M_string_length) {
                if (sVar1 != 0) {
                  iVar6 = bcmp((__x->_M_dataplus)._M_p,(symbol->_M_dataplus)._M_p,sVar1);
                  if (iVar6 != 0) goto LAB_00129819;
                }
                iVar6 = iVar11 + 0x3f;
                if (-1 < iVar11) {
                  iVar6 = iVar11;
                }
                if ((*(ulong *)(local_128._32_8_ +
                               (ulong)(((long)iVar11 & 0x800000000000003fU) < 0x8000000000000001) *
                               8 + (long)(iVar6 >> 6) * 8 + -8) >> ((long)iVar11 & 0x3fU) & 1) != 0)
                {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_b8,__x);
                }
                iVar11 = iVar11 + 1;
              }
              else {
LAB_00129819:
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_b8,__x);
              }
              uVar9 = uVar9 + 1;
              lVar8 = lVar8 + 0x20;
            } while (uVar9 < (ulong)((long)(local_d0._8_8_ - local_d0._0_8_) >> 5));
          }
          this_00 = (Production *)operator_new(0x38);
          this = (CFG *)local_e0._M_p;
          Production::Production(this_00,&local_d8->fromP,&local_b8);
          iVar2._M_current = *(pointer *)((long)this + 0x38);
          local_50 = this_00;
          if (iVar2._M_current == *(pointer *)((long)this + 0x40)) {
            std::vector<Production*,std::allocator<Production*>>::
            _M_realloc_insert<Production*const&>(local_78,iVar2,&local_50);
          }
          else {
            *iVar2._M_current = this_00;
            *(pointer *)((long)this + 0x38) = *(pointer *)((long)this + 0x38) + 1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_b8);
          if ((Production *)local_128._32_8_ != (Production *)0x0) {
            operator_delete((void *)local_128._32_8_,(long)local_e8 - local_128._32_8_);
          }
          pPVar7 = (Production *)
                   &(pPVar7->toP).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (pPVar7 != local_70);
      }
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 *)local_128);
    }
  }
  pCVar10 = (CFG *)&this->productionsP;
  std::vector<Production_*,_std::allocator<Production_*>_>::vector
            (&local_68,(vector<Production_*,_std::allocator<Production_*>_> *)pCVar10);
  removeDoubleProductions
            ((vector<Production_*,_std::allocator<Production_*>_> *)(local_128 + 0x20),pCVar10,
             &local_68);
  ppPVar3 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar4 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_128._32_8_;
  (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pPStack_100;
  (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_f8;
  local_128._32_8_ = (pointer)0x0;
  pPStack_100 = (Production *)0x0;
  local_f8 = (pointer)0x0;
  if (ppPVar3 != (pointer)0x0) {
    operator_delete(ppPVar3,(long)ppPVar4 - (long)ppPVar3);
    if ((pointer)local_128._32_8_ != (pointer)0x0) {
      operator_delete((void *)local_128._32_8_,(long)local_f8 - local_128._32_8_);
    }
  }
  if (local_68.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d0);
  return;
}

Assistant:

void CFG::removeNullableSymbol(std::string symbol, Production *production) {
    bool changed = false;
    std::vector<std::string> productionsTo = production->getToP();
    std::vector<std::string> withoutSymbol = {};
    int symbolCount = 0;
    for (int i = 0; i < productionsTo.size(); ++i) {
        if (productionsTo[i] != symbol) {
            withoutSymbol.push_back(productionsTo[i]);
        } else {
            symbolCount++;
            changed = true;
        }
    }
    if (changed) {
        Production *newProduction = new Production(production->getFromP(), withoutSymbol);
        productionsP.push_back(newProduction);
    }

    if (symbolCount > 1) {
        std::vector<std::vector<bool>> permutations = findPermutations(symbolCount);
        permutations = filterAll0orAll1(permutations); // Since already included

        for (auto permu: permutations) {
            std::vector<std::string> withoutSymbol = {};
            int symbolCount = 0;
            for (int i = 0; i < productionsTo.size(); ++i) {
                if (productionsTo[i] != symbol) {
                    withoutSymbol.push_back(productionsTo[i]);
                } else {
                    if (permu[symbolCount]) {
                        withoutSymbol.push_back(productionsTo[i]);
                    }
                    symbolCount++;
                }
            }
            Production *newProduction = new Production(production->getFromP(), withoutSymbol);
            productionsP.push_back(newProduction);
        }
    }

    productionsP = removeDoubleProductions(productionsP);
}